

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

UChar * u_strFindFirst_63(UChar *s,int32_t length,UChar *sub,int32_t subLength)

{
  long lVar1;
  bool bVar2;
  UBool UVar3;
  UChar UVar4;
  UChar *t;
  UChar *pUVar5;
  UChar *pUVar6;
  UChar UVar7;
  UChar UVar8;
  long lVar9;
  UChar *pUVar10;
  int iVar11;
  long lVar12;
  UChar *unaff_R15;
  
  if (subLength < -1 || sub == (UChar *)0x0) {
    return s;
  }
  if (-2 < length && s != (UChar *)0x0) {
    if ((subLength & length) < 0) {
      UVar7 = *sub;
      if (UVar7 == L'\0') {
        return s;
      }
      if (((UVar7 & 0xf800U) != 0xd800) && (sub[1] == L'\0')) goto LAB_0037b0f9;
      UVar4 = *s;
      pUVar5 = s;
      if (UVar4 != L'\0') {
        do {
          pUVar6 = pUVar5 + 1;
          if (UVar4 == UVar7) {
            UVar8 = sub[1];
            pUVar10 = pUVar6;
            if (UVar8 != L'\0') {
              lVar12 = 2;
              do {
                if (*(UChar *)((long)pUVar5 + lVar12) == L'\0') {
                  return (UChar *)0x0;
                }
                if (*(UChar *)((long)pUVar5 + lVar12) != UVar8) goto LAB_0037b1c0;
                UVar8 = *(UChar *)((long)sub + lVar12 + 2);
                lVar12 = lVar12 + 2;
              } while (UVar8 != L'\0');
              pUVar10 = (UChar *)(lVar12 + (long)pUVar5);
            }
            if ((pUVar5 == s || (UVar4 & 0xfc00U) != 0xdc00) || ((pUVar5[-1] & 0xfc00U) != 0xd800))
            {
              if ((pUVar10[-1] & 0xfc00U) != 0xd800) {
                return pUVar5;
              }
              if ((*pUVar10 & 0xfc00U) != 0xdc00) {
                return pUVar5;
              }
            }
          }
LAB_0037b1c0:
          UVar4 = *pUVar6;
          pUVar5 = pUVar6;
          if (UVar4 == L'\0') {
            return (UChar *)0x0;
          }
        } while( true );
      }
    }
    else {
      if (subLength < 0) {
        subLength = -1;
        pUVar5 = sub;
        do {
          subLength = subLength + 1;
          UVar7 = *pUVar5;
          pUVar5 = pUVar5 + 1;
        } while (UVar7 != L'\0');
      }
      if (subLength == 0) {
        return s;
      }
      UVar7 = *sub;
      iVar11 = subLength + -1;
      if ((UVar7 & 0xf800U) != 0xd800 && iVar11 == 0) {
        if (-1 < length) {
          pUVar5 = u_memchr_63(s,UVar7,length);
          return pUVar5;
        }
LAB_0037b0f9:
        pUVar5 = u_strchr_63(s,UVar7);
        return pUVar5;
      }
      lVar12 = (long)iVar11;
      if (length < 0) {
        UVar4 = *s;
        if (UVar4 != L'\0') {
          pUVar5 = s;
          do {
            pUVar6 = pUVar5 + 1;
            if (UVar4 == UVar7) {
              pUVar10 = pUVar6;
              if (iVar11 != 0) {
                lVar9 = 2;
                do {
                  if (*(short *)((long)pUVar5 + lVar9) == 0) {
                    return (UChar *)0x0;
                  }
                  if (*(short *)((long)pUVar5 + lVar9) != *(short *)((long)sub + lVar9))
                  goto LAB_0037b24e;
                  lVar1 = lVar9 + lVar12 * -2;
                  lVar9 = lVar9 + 2;
                } while (lVar1 != 0);
                pUVar10 = (UChar *)(lVar9 + (long)pUVar5);
              }
              UVar3 = isMatchAtCPBoundary(s,pUVar5,pUVar10,(UChar *)0x0);
              if (UVar3 != '\0') {
                return pUVar5;
              }
            }
LAB_0037b24e:
            UVar4 = *pUVar6;
            pUVar5 = pUVar6;
          } while (UVar4 != L'\0');
        }
      }
      else {
        if (length < subLength) {
          bVar2 = false;
          unaff_R15 = (UChar *)0x0;
        }
        else {
          pUVar5 = s + (uint)length;
          bVar2 = true;
          if (pUVar5 + -lVar12 != s) {
            pUVar6 = s;
            do {
              unaff_R15 = pUVar6;
              pUVar6 = unaff_R15 + 1;
              if (*unaff_R15 == UVar7) {
                pUVar10 = pUVar6;
                if (iVar11 != 0) {
                  lVar9 = 2;
                  do {
                    if (*(short *)((long)unaff_R15 + lVar9) != *(short *)((long)sub + lVar9))
                    goto LAB_0037b322;
                    lVar1 = lVar9 + lVar12 * -2;
                    lVar9 = lVar9 + 2;
                  } while (lVar1 != 0);
                  pUVar10 = (UChar *)(lVar9 + (long)unaff_R15);
                }
                if (((unaff_R15 == s || (*unaff_R15 & 0xfc00U) != 0xdc00) ||
                    ((unaff_R15[-1] & 0xfc00U) != 0xd800)) &&
                   ((unaff_R15 == pUVar5 ||
                    (((pUVar10[-1] & 0xfc00U) != 0xd800 || ((*pUVar10 & 0xfc00U) != 0xdc00)))))) {
                  bVar2 = false;
                  break;
                }
              }
LAB_0037b322:
            } while (pUVar6 != pUVar5 + -lVar12);
          }
        }
        if (!bVar2) {
          return unaff_R15;
        }
      }
    }
  }
  return (UChar *)0x0;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strFindFirst(const UChar *s, int32_t length,
               const UChar *sub, int32_t subLength) {
    const UChar *start, *p, *q, *subLimit;
    UChar c, cs, cq;

    if(sub==NULL || subLength<-1) {
        return (UChar *)s;
    }
    if(s==NULL || length<-1) {
        return NULL;
    }

    start=s;

    if(length<0 && subLength<0) {
        /* both strings are NUL-terminated */
        if((cs=*sub++)==0) {
            return (UChar *)s;
        }
        if(*sub==0 && !U16_IS_SURROGATE(cs)) {
            /* the substring consists of a single, non-surrogate BMP code point */
            return u_strchr(s, cs);
        }

        while((c=*s++)!=0) {
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if((cq=*q)==0) {
                        if(isMatchAtCPBoundary(start, s-1, p, NULL)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if((c=*p)==0) {
                        return NULL; /* no match, and none possible after s */
                    }
                    if(c!=cq) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }

        /* not found */
        return NULL;
    }

    if(subLength<0) {
        subLength=u_strlen(sub);
    }
    if(subLength==0) {
        return (UChar *)s;
    }

    /* get sub[0] to search for it fast */
    cs=*sub++;
    --subLength;
    subLimit=sub+subLength;

    if(subLength==0 && !U16_IS_SURROGATE(cs)) {
        /* the substring consists of a single, non-surrogate BMP code point */
        return length<0 ? u_strchr(s, cs) : u_memchr(s, cs, length);
    }

    if(length<0) {
        /* s is NUL-terminated */
        while((c=*s++)!=0) {
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if(q==subLimit) {
                        if(isMatchAtCPBoundary(start, s-1, p, NULL)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if((c=*p)==0) {
                        return NULL; /* no match, and none possible after s */
                    }
                    if(c!=*q) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }
    } else {
        const UChar *limit, *preLimit;

        /* subLength was decremented above */
        if(length<=subLength) {
            return NULL; /* s is shorter than sub */
        }

        limit=s+length;

        /* the substring must start before preLimit */
        preLimit=limit-subLength;

        while(s!=preLimit) {
            c=*s++;
            if(c==cs) {
                /* found first substring UChar, compare rest */
                p=s;
                q=sub;
                for(;;) {
                    if(q==subLimit) {
                        if(isMatchAtCPBoundary(start, s-1, p, limit)) {
                            return (UChar *)(s-1); /* well-formed match */
                        } else {
                            break; /* no match because surrogate pair is split */
                        }
                    }
                    if(*p!=*q) {
                        break; /* no match */
                    }
                    ++p;
                    ++q;
                }
            }
        }
    }

    /* not found */
    return NULL;
}